

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,short>
          (TryCast *this,string_t input,int16_t *result,bool strict)

{
  char *pcVar1;
  uint uVar2;
  IntegerCastData<short> IVar3;
  ulong uVar4;
  bool bVar5;
  byte bVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  short sVar11;
  ResultType_conflict *pRVar12;
  char cVar13;
  ulong uVar14;
  char *pcVar15;
  byte bVar16;
  long lVar17;
  idx_t iVar18;
  char *pcVar19;
  char *pcVar20;
  ulong uVar21;
  ulong uVar22;
  ExponentData exponent;
  IntegerCastData<short> simple_data;
  bool local_88;
  IntegerDecimalCastData<short> local_78;
  ResultType_conflict *local_60;
  char *local_58;
  ulong local_50;
  ulong local_48;
  string_t input_local;
  
  pRVar12 = input.value._8_8_;
  input_local.value.pointer.ptr = input.value._0_8_;
  pcVar20 = input.value._0_8_;
  if ((uint)this < 0xd) {
    pcVar20 = input_local.value.pointer.prefix;
  }
  uVar21 = (ulong)this & 0xffffffff;
  uVar22 = 0;
  while( true ) {
    iVar18 = uVar21 - uVar22;
    local_88 = SUB81(result,0);
    input_local.value._0_8_ = this;
    if (iVar18 == 0) break;
    bVar6 = pcVar20[uVar22];
    if ((0x20 < (ulong)bVar6) || ((0x100003e00U >> ((ulong)bVar6 & 0x3f) & 1) == 0)) {
      simple_data.result = 0;
      if (bVar6 == 0x2d) {
        bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar20 + uVar22,iVar18,&simple_data,local_88);
      }
      else {
        if ((uVar21 - 1 != uVar22) && (bVar6 == 0x30)) {
          cVar13 = pcVar20[uVar22 + 1];
          if (cVar13 == 'B') {
LAB_00241590:
            uVar14 = ~uVar22 + uVar21;
            uVar7 = 1;
            goto LAB_00241598;
          }
          if (cVar13 != 'x') {
            if (cVar13 == 'b') goto LAB_00241590;
            if (cVar13 != 'X') {
              if ((local_88 & (byte)(cVar13 - 0x30U) < 10) == 0) goto LAB_00241626;
              break;
            }
          }
          local_50 = ~uVar22 + uVar21;
          uVar7 = 1;
          local_60 = pRVar12;
          goto LAB_00241491;
        }
LAB_00241626:
        bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar20 + uVar22,iVar18,&simple_data,local_88);
      }
      if (bVar5 != false) goto LAB_0024163a;
      break;
    }
    uVar22 = uVar22 + 1;
  }
LAB_0024164e:
  uVar22 = 0;
  while( true ) {
    pcVar19 = (char *)(uVar21 - uVar22);
    if (pcVar19 == (char *)0x0) {
      return false;
    }
    bVar6 = pcVar20[uVar22];
    if ((0x20 < (ulong)bVar6) || ((0x100003e00U >> ((ulong)bVar6 & 0x3f) & 1) == 0)) break;
    uVar22 = uVar22 + 1;
  }
  local_78._16_8_ = 0;
  local_78.result = 0;
  local_78.decimal = 0;
  local_60 = pRVar12;
  if (bVar6 == 0x2d) {
    local_78.result = 0;
    pcVar8 = (char *)0x1;
    while (pcVar10 = pcVar8, pcVar10 < pcVar19) {
      pcVar15 = pcVar20 + (long)pcVar10;
      bVar6 = pcVar15[uVar22];
      bVar16 = bVar6 - 0x30;
      if (9 < bVar16) {
        if (bVar6 != 0x2e) goto LAB_00241aaa;
        if (local_88 != false) {
          return false;
        }
        pcVar8 = pcVar10 + 1;
        local_78.decimal_digits = 0;
        pcVar15 = pcVar8;
        local_78.decimal = 0;
        goto LAB_00241973;
      }
      uVar7 = (0x8000000000000000 - (ulong)bVar16) / 10;
      if (SBORROW8(local_78.result,-uVar7) != (long)(local_78.result + uVar7) < 0) {
        return false;
      }
      local_78.result = local_78.result * 10 - (ulong)bVar16;
      pcVar8 = pcVar19;
      if ((~(ulong)pcVar10 + uVar21 != uVar22) &&
         (pcVar8 = pcVar10 + 1, pcVar15[uVar22 + 1] == '_' && local_88 == false)) {
        if ((uVar21 - (long)pcVar10) - 2 == uVar22) {
          return false;
        }
        pcVar8 = pcVar10 + 2;
        if (9 < (byte)(pcVar15[uVar22 + 2] - 0x30U)) {
          return false;
        }
      }
    }
LAB_00241929:
    bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,true>
                      (&local_78);
    if (!bVar5) {
      return false;
    }
    if (pcVar10 < (char *)0x2) {
      return false;
    }
    goto LAB_00241c3d;
  }
  if ((uVar21 - 1 == uVar22) || (bVar6 != 0x30)) {
    if ((local_88 & bVar6 == 0x2b) != 0) {
      return false;
    }
    pcVar8 = (char *)(ulong)(bVar6 == 0x2b);
LAB_00241880:
    local_78.result = 0;
    pcVar10 = pcVar8;
    while (pcVar15 = pcVar10, pcVar15 < pcVar19) {
      pcVar9 = pcVar20 + (long)pcVar15;
      bVar6 = pcVar9[uVar22];
      bVar16 = bVar6 - 0x30;
      if (9 < bVar16) {
        if (bVar6 != 0x2e) goto LAB_00241c54;
        if (local_88 != false) {
          return false;
        }
        local_58 = pcVar15 + 1;
        local_78.decimal_digits = 0;
        pcVar10 = local_58;
        local_78.decimal = 0;
        goto LAB_00241b47;
      }
      if ((long)(((ulong)bVar16 ^ 0x7ffffffffffffffe) / 10) < local_78.result) {
        return false;
      }
      local_78.result = local_78.result * 10 + (ulong)bVar16;
      pcVar10 = pcVar19;
      if ((~(ulong)pcVar15 + uVar21 != uVar22) &&
         (pcVar10 = pcVar15 + 1, pcVar9[uVar22 + 1] == '_' && local_88 == false)) {
        if ((uVar21 - (long)pcVar15) - 2 == uVar22) {
          return false;
        }
        pcVar10 = pcVar15 + 2;
        if (9 < (byte)(pcVar9[uVar22 + 2] - 0x30U)) {
          return false;
        }
      }
    }
LAB_00241afc:
    bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                      (&local_78);
    if (!bVar5) {
      return false;
    }
    if (pcVar15 <= pcVar8) {
      return false;
    }
    goto LAB_00241c3d;
  }
  cVar13 = pcVar20[uVar22 + 1];
  if (cVar13 == 'B') {
LAB_00241a0c:
    local_78.result = 0;
    uVar7 = 1;
    while (uVar7 < ~uVar22 + uVar21) {
      uVar14 = 0;
      if ((pcVar20[uVar22 + 1 + uVar7] != '0') && (uVar14 = 1, pcVar20[uVar22 + 1 + uVar7] != '1'))
      {
        return false;
      }
      uVar4 = ~uVar22 + uVar21;
      if ((uVar21 - uVar7) - 2 != uVar22) {
        if (pcVar20[uVar22 + 2 + uVar7] == '_') {
          if ((uVar21 - uVar7) - 3 == uVar22) {
            return false;
          }
          if ((pcVar20[uVar22 + 3 + uVar7] & 0xfeU) != 0x30) {
            return false;
          }
          uVar4 = uVar7 + 2;
        }
        else {
          uVar4 = uVar7 + 1;
        }
      }
      uVar7 = uVar4;
      if (0x3fffffffffffffff < local_78.result) {
        return false;
      }
      local_78.result = uVar14 + local_78.result * 2;
    }
  }
  else {
    if (cVar13 != 'x') {
      if (cVar13 == 'b') goto LAB_00241a0c;
      if (cVar13 != 'X') {
        if ((local_88 & (byte)(cVar13 - 0x30U) < 10) != 0) {
          return false;
        }
        pcVar8 = (char *)0x0;
        goto LAB_00241880;
      }
    }
    uVar7 = 1;
    while (uVar7 < ~uVar22 + uVar21) {
      bVar6 = pcVar20[uVar22 + 1 + uVar7];
      bVar16 = bVar6 | 0x20;
      if (0x19 < (byte)(bVar6 + 0xbf)) {
        bVar16 = bVar6;
      }
      bVar5 = StringUtil::CharacterIsHex(bVar16);
      if (!bVar5) {
        return false;
      }
      cVar13 = -0x30;
      if ('`' < (char)bVar16) {
        cVar13 = -0x57;
      }
      uVar14 = ~uVar22 + uVar21;
      if ((uVar21 - uVar7) - 2 != uVar22) {
        if (pcVar20[uVar22 + 2 + uVar7] == '_') {
          if ((uVar21 - uVar7) - 3 == uVar22) {
            return false;
          }
          bVar5 = StringUtil::CharacterIsHex(pcVar20[uVar22 + 3 + uVar7]);
          if (!bVar5) {
            return false;
          }
          uVar14 = uVar7 + 2;
        }
        else {
          uVar14 = uVar7 + 1;
        }
      }
      if ((long)((ulong)((byte)(cVar13 + bVar16) >> 4) ^ 0x7ffffffffffffff) < local_78.result) {
        return false;
      }
      local_78.result = local_78.result * 0x10 + (ulong)(byte)(cVar13 + bVar16);
      uVar7 = uVar14;
    }
  }
  bVar5 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                    (&local_78);
  if (uVar7 < 2 || !bVar5) {
    return false;
  }
LAB_00241c3d:
  *local_60 = (ResultType_conflict)local_78.result;
  return true;
LAB_00241598:
  if (uVar14 <= uVar7) goto joined_r0x00241615;
  if (pcVar20[uVar22 + 1 + uVar7] == '0') {
    sVar11 = 0;
  }
  else {
    if (pcVar20[uVar22 + 1 + uVar7] != '1') goto LAB_0024164e;
    sVar11 = 1;
  }
  uVar4 = uVar14;
  if ((uVar21 - uVar7) - 2 != uVar22) {
    if (pcVar20[uVar22 + 2 + uVar7] == '_') {
      if (((uVar21 - uVar7) - 3 == uVar22) || ((pcVar20[uVar22 + 3 + uVar7] & 0xfeU) != 0x30))
      goto LAB_0024164e;
      uVar4 = uVar7 + 2;
    }
    else {
      uVar4 = uVar7 + 1;
    }
  }
  uVar7 = uVar4;
  if (0x3fff < simple_data.result) goto LAB_0024164e;
  simple_data.result = sVar11 + simple_data.result * 2;
  goto LAB_00241598;
LAB_00241491:
  IVar3.result = simple_data.result;
  pRVar12 = local_60;
  if (local_50 <= uVar7) goto joined_r0x00241615;
  local_58 = pcVar20 + uVar7;
  bVar6 = local_58[uVar22 + 1];
  bVar16 = bVar6 | 0x20;
  if (0x19 < (byte)(bVar6 + 0xbf)) {
    bVar16 = bVar6;
  }
  bVar5 = StringUtil::CharacterIsHex(bVar16);
  pRVar12 = local_60;
  if (!bVar5) goto LAB_0024164e;
  cVar13 = -0x30;
  if ('`' < (char)bVar16) {
    cVar13 = -0x57;
  }
  uVar14 = local_50;
  if ((uVar21 - uVar7) - 2 != uVar22) {
    if (local_58[uVar22 + 2] == '_') {
      local_48 = uVar7;
      if (((uVar21 - uVar7) - 3 == uVar22) ||
         (bVar5 = StringUtil::CharacterIsHex(local_58[uVar22 + 3]), pRVar12 = local_60, !bVar5))
      goto LAB_0024164e;
      uVar14 = local_48 + 2;
    }
    else {
      uVar14 = uVar7 + 1;
    }
  }
  pRVar12 = local_60;
  if ((short)((byte)(cVar13 + bVar16) >> 4 ^ 0x7ff) < IVar3.result) goto LAB_0024164e;
  simple_data.result = IVar3.result * 0x10 + (ushort)(byte)(cVar13 + bVar16);
  uVar7 = uVar14;
  goto LAB_00241491;
joined_r0x00241615:
  if (1 < uVar7) {
LAB_0024163a:
    *pRVar12 = simple_data.result;
    return true;
  }
  goto LAB_0024164e;
LAB_00241973:
  pcVar9 = pcVar15;
  if (pcVar9 < pcVar19) {
    pcVar1 = pcVar20 + (long)pcVar9;
    bVar6 = pcVar1[uVar22];
    bVar16 = bVar6 - 0x30;
    if (bVar16 < 10) goto code_r0x00241993;
    bVar5 = pcVar10 < (char *)0x2;
    local_78._18_6_ = 0;
    pcVar10 = pcVar9;
    if (pcVar9 <= pcVar8 && bVar5) {
      return false;
    }
LAB_00241aaa:
    uVar2 = (uint)bVar6;
    if (uVar2 - 9 < 5) {
LAB_00241ab9:
      pcVar8 = pcVar10 + 1;
      pcVar10 = pcVar8;
      if (pcVar8 < pcVar19) {
        pcVar10 = pcVar19;
      }
      for (; pcVar8 < pcVar19; pcVar8 = pcVar8 + 1) {
        if (0x20 < (ulong)(byte)(pcVar20 + (long)pcVar8)[uVar22]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)(pcVar20 + (long)pcVar8)[uVar22] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_00241929;
    }
    if ((uVar2 != 0x65) && (uVar2 != 0x45)) {
      if (uVar2 != 0x20) {
        return false;
      }
      goto LAB_00241ab9;
    }
    if (pcVar10 == (char *)0x1 || local_88 != false) {
      return false;
    }
    if (pcVar19 <= pcVar10 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar20 = pcVar20 + (long)pcVar10 + uVar22 + 1;
    iVar18 = ~uVar22 + (uVar21 - (long)pcVar10);
    if (*pcVar20 == '-') {
      bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar20,iVar18,&exponent,false);
    }
    else {
      bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar20,iVar18,&exponent,false);
    }
    if (bVar5 == false) {
      return false;
    }
    bVar5 = IntegerDecimalCastOperation::HandleExponent<duckdb::IntegerDecimalCastData<short>,true>
                      (&local_78,exponent.result);
    goto LAB_00241e36;
  }
  bVar5 = pcVar10 < (char *)0x2;
  local_78._18_6_ = 0;
  pcVar10 = pcVar9;
  if (pcVar9 <= pcVar8 && bVar5) {
    return false;
  }
  goto LAB_00241929;
code_r0x00241993:
  uVar7 = ((ulong)bVar16 ^ 0x7ffffffffffffffe) / 10;
  lVar17 = local_78.decimal * 10 + (ulong)bVar16;
  if ((long)uVar7 < local_78.decimal) {
    lVar17 = local_78.decimal;
  }
  local_78.decimal_digits = local_78.decimal_digits + (local_78.decimal <= (long)uVar7);
  pcVar15 = pcVar19;
  local_78.decimal = lVar17;
  if ((~(ulong)pcVar9 + uVar21 != uVar22) && (pcVar15 = pcVar9 + 1, pcVar1[uVar22 + 1] == '_')) {
    if ((uVar21 - (long)pcVar9) - 2 == uVar22) {
      return false;
    }
    pcVar15 = pcVar9 + 2;
    if (9 < (byte)(pcVar1[uVar22 + 2] - 0x30U)) {
      return false;
    }
  }
  goto LAB_00241973;
LAB_00241b47:
  pcVar9 = pcVar10;
  if (pcVar19 <= pcVar9) {
    bVar5 = pcVar15 <= pcVar8;
    local_78._18_6_ = 0;
    pcVar15 = pcVar9;
    if (pcVar9 <= local_58 && bVar5) {
      return false;
    }
    goto LAB_00241afc;
  }
  pcVar1 = pcVar20 + (long)pcVar9;
  bVar6 = pcVar1[uVar22];
  bVar16 = bVar6 - 0x30;
  if (9 < bVar16) {
    bVar5 = pcVar15 <= pcVar8;
    local_78._18_6_ = 0;
    pcVar15 = pcVar9;
    if (pcVar9 <= local_58 && bVar5) {
      return false;
    }
LAB_00241c54:
    uVar2 = (uint)bVar6;
    if (4 < uVar2 - 9) {
      if ((uVar2 == 0x65) || (uVar2 == 0x45)) {
        if (pcVar15 == pcVar8 || local_88 != false) {
          return false;
        }
        if (pcVar19 <= pcVar15 + 1) {
          return false;
        }
        exponent.result = 0;
        pcVar20 = pcVar20 + (long)pcVar15 + uVar22 + 1;
        iVar18 = ~uVar22 + (uVar21 - (long)pcVar15);
        if (*pcVar20 == '-') {
          bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar20,iVar18,&exponent,false);
        }
        else {
          bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar20,iVar18,&exponent,false);
        }
        if (bVar5 == false) {
          return false;
        }
        bVar5 = IntegerDecimalCastOperation::
                HandleExponent<duckdb::IntegerDecimalCastData<short>,false>
                          (&local_78,exponent.result);
LAB_00241e36:
        if (bVar5 == false) {
          return false;
        }
        goto LAB_00241c3d;
      }
      if (uVar2 != 0x20) {
        return false;
      }
    }
    pcVar10 = pcVar15 + 1;
    pcVar15 = pcVar10;
    if (pcVar10 < pcVar19) {
      pcVar15 = pcVar19;
    }
    for (; pcVar10 < pcVar19; pcVar10 = pcVar10 + 1) {
      if (0x20 < (ulong)(byte)(pcVar20 + (long)pcVar10)[uVar22]) {
        return false;
      }
      if ((0x100003e00U >> ((ulong)(byte)(pcVar20 + (long)pcVar10)[uVar22] & 0x3f) & 1) == 0) {
        return false;
      }
    }
    goto LAB_00241afc;
  }
  uVar7 = ((ulong)bVar16 ^ 0x7ffffffffffffffe) / 10;
  lVar17 = local_78.decimal * 10 + (ulong)bVar16;
  if ((long)uVar7 < local_78.decimal) {
    lVar17 = local_78.decimal;
  }
  local_78.decimal_digits = local_78.decimal_digits + (local_78.decimal <= (long)uVar7);
  pcVar10 = pcVar19;
  local_78.decimal = lVar17;
  if ((~(ulong)pcVar9 + uVar21 != uVar22) && (pcVar10 = pcVar9 + 1, pcVar1[uVar22 + 1] == '_')) {
    if ((uVar21 - (long)pcVar9) - 2 == uVar22) {
      return false;
    }
    pcVar10 = pcVar9 + 2;
    if (9 < (byte)(pcVar1[uVar22 + 2] - 0x30U)) {
      return false;
    }
  }
  goto LAB_00241b47;
}

Assistant:

bool TryCast::Operation(string_t input, int16_t &result, bool strict) {
	return TrySimpleIntegerCast<int16_t>(input.GetData(), input.GetSize(), result, strict);
}